

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void __thiscall OpenMesh::IO::_PLYReader_::_PLYReader_(_PLYReader_ *this)

{
  _IOManager_ *this_00;
  mapped_type_conflict *pmVar1;
  key_type local_5c [19];
  _PLYReader_ *local_10;
  _PLYReader_ *this_local;
  
  local_10 = this;
  BaseReader::BaseReader(&this->super_BaseReader);
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___PLYReader__003de1c0;
  Options::Options(&this->options_);
  Options::Options(&this->userOptions_);
  std::
  map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
  ::map(&this->scalar_size_);
  std::
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  ::map(&this->vertexPropertyMap_);
  this_00 = IOManager();
  _IOManager_::register_module(this_00,&this->super_BaseReader);
  local_5c[0xf] = 1;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 0xf);
  *pmVar1 = 1;
  local_5c[0xe] = 3;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 0xe);
  *pmVar1 = 1;
  local_5c[0xd] = 5;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 0xd);
  *pmVar1 = 2;
  local_5c[0xc] = 7;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 0xc);
  *pmVar1 = 2;
  local_5c[0xb] = 9;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 0xb);
  *pmVar1 = 4;
  local_5c[10] = 0xb;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 10);
  *pmVar1 = 4;
  local_5c[9] = 0xd;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 9);
  *pmVar1 = 4;
  local_5c[8] = 0xf;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 8);
  *pmVar1 = 8;
  local_5c[7] = 2;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 7);
  *pmVar1 = 1;
  local_5c[6] = 4;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 6);
  *pmVar1 = 1;
  local_5c[5] = 6;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 5);
  *pmVar1 = 2;
  local_5c[4] = 8;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 4);
  *pmVar1 = 2;
  local_5c[3] = 10;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 3);
  *pmVar1 = 4;
  local_5c[2] = 0xc;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 2);
  *pmVar1 = 4;
  local_5c[1] = 0xe;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c + 1);
  *pmVar1 = 4;
  local_5c[0] = ValueTypeDOUBLE;
  pmVar1 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](&this->scalar_size_,local_5c);
  *pmVar1 = 8;
  return;
}

Assistant:

_PLYReader_::_PLYReader_() {
    IOManager().register_module(this);

    // Store sizes in byte of each property type
    scalar_size_[ValueTypeINT8] = 1;
    scalar_size_[ValueTypeUINT8] = 1;
    scalar_size_[ValueTypeINT16] = 2;
    scalar_size_[ValueTypeUINT16] = 2;
    scalar_size_[ValueTypeINT32] = 4;
    scalar_size_[ValueTypeUINT32] = 4;
    scalar_size_[ValueTypeFLOAT32] = 4;
    scalar_size_[ValueTypeFLOAT64] = 8;

    scalar_size_[ValueTypeCHAR] = 1;
    scalar_size_[ValueTypeUCHAR] = 1;
    scalar_size_[ValueTypeSHORT] = 2;
    scalar_size_[ValueTypeUSHORT] = 2;
    scalar_size_[ValueTypeINT] = 4;
    scalar_size_[ValueTypeUINT] = 4;
    scalar_size_[ValueTypeFLOAT] = 4;
    scalar_size_[ValueTypeDOUBLE] = 8;
}